

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

ssize_t __thiscall covenant::CFG::write(CFG *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  ostream *o;
  ulong uVar3;
  
  o = (ostream *)CONCAT44(in_register_00000034,__fd);
  std::__ostream_insert<char,std::char_traits<char>>(o,"start symbol: ",0xe);
  poVar1 = operator<<(o,(Sym)(this->start * 2 + 1));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      printProduction(this,o,(uint)uVar3);
      uVar3 = (ulong)((uint)uVar3 + 1);
      uVar2 = ((long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
  }
  return (ssize_t)o;
}

Assistant:

ostream & write(ostream &o) const 
    {
      o << "start symbol: " << startSym () << endl;
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        printProduction(o, vv);
      }
      return o;
    }